

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest03VerifyingNameChaining_::
Section3ValidRFC3280MandatoryAttributeTypesTest7<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section3ValidRFC3280MandatoryAttributeTypesTest7<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.3.7";
  local_88.should_validate = true;
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_28892d_005b3460,(char *(*) [3])&PTR_anon_var_dwarf_28895f_005b3480,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest03VerifyingNameChaining,
                     Section3ValidRFC3280MandatoryAttributeTypesTest7) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "RFC3280MandatoryAttributeTypesCACert",
                               "ValidRFC3280MandatoryAttributeTypesTest7EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "RFC3280MandatoryAttributeTypesCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.3.7";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}